

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

void ConvexDecomposition::extrude(cbtHullTriangle *t0,int v)

{
  int iVar1;
  int b;
  int a;
  int iVar2;
  int iVar3;
  int iVar4;
  cbtHullTriangle *t;
  int iVar5;
  cbtHullTriangle *pcVar6;
  int *piVar7;
  cbtHullTriangle *t_00;
  cbtHullTriangle *t_01;
  
  iVar5 = DAT_00b6ffa0;
  b = (t0->super_int3).x;
  a = (t0->super_int3).y;
  iVar2 = (t0->super_int3).z;
  pcVar6 = (cbtHullTriangle *)::operator_new(0x24);
  (pcVar6->super_int3).x = v;
  (pcVar6->super_int3).y = a;
  (pcVar6->super_int3).z = iVar2;
  (pcVar6->n).x = -1;
  (pcVar6->n).y = -1;
  (pcVar6->n).z = -1;
  pcVar6->id = iVar5;
  Array<ConvexDecomposition::cbtHullTriangle_*>::Add
            ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,pcVar6);
  iVar4 = iVar5 + 1;
  iVar1 = iVar5 + 2;
  pcVar6->vmax = -1;
  pcVar6->rise = 0.0;
  iVar3 = (t0->n).x;
  (pcVar6->n).x = iVar3;
  (pcVar6->n).y = iVar4;
  (pcVar6->n).z = iVar1;
  if ((-1 < (long)iVar3) && (iVar3 < DAT_00b6ffa0)) {
    piVar7 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar3 * 8),a,iVar2);
    *piVar7 = iVar5;
    t_00 = (cbtHullTriangle *)::operator_new(0x24);
    (t_00->super_int3).x = v;
    iVar3 = DAT_00b6ffa0;
    (t_00->super_int3).y = iVar2;
    (t_00->super_int3).z = b;
    (t_00->n).x = -1;
    (t_00->n).y = -1;
    (t_00->n).z = -1;
    t_00->id = iVar3;
    Array<ConvexDecomposition::cbtHullTriangle_*>::Add
              ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,t_00);
    t_00->vmax = -1;
    t_00->rise = 0.0;
    iVar3 = (t0->n).y;
    (t_00->n).x = iVar3;
    (t_00->n).y = iVar1;
    (t_00->n).z = iVar5;
    if ((-1 < (long)iVar3) && (iVar3 < DAT_00b6ffa0)) {
      piVar7 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar3 * 8),iVar2,b);
      *piVar7 = iVar4;
      t_01 = (cbtHullTriangle *)::operator_new(0x24);
      (t_01->super_int3).x = v;
      (t_01->super_int3).y = b;
      (t_01->super_int3).z = a;
      (t_01->n).x = -1;
      (t_01->n).y = -1;
      (t_01->n).z = -1;
      t_01->id = DAT_00b6ffa0;
      Array<ConvexDecomposition::cbtHullTriangle_*>::Add
                ((Array<ConvexDecomposition::cbtHullTriangle_*> *)&tris,t_01);
      t_01->vmax = -1;
      t_01->rise = 0.0;
      iVar2 = (t0->n).z;
      (t_01->n).x = iVar2;
      (t_01->n).y = iVar5;
      (t_01->n).z = iVar4;
      if ((-1 < (long)iVar2) && (iVar2 < DAT_00b6ffa0)) {
        piVar7 = cbtHullTriangle::neib(*(cbtHullTriangle **)(tris + (long)iVar2 * 8),b,a);
        *piVar7 = iVar1;
        checkit(pcVar6);
        checkit(t_00);
        checkit(t_01);
        iVar4 = (pcVar6->n).x;
        if ((-1 < (long)iVar4) && (iVar4 < DAT_00b6ffa0)) {
          t = *(cbtHullTriangle **)(tris + (long)iVar4 * 8);
          if ((((t->super_int3).x == v) || ((t->super_int3).y == v)) || ((t->super_int3).z == v)) {
            removeb2b(pcVar6,t);
          }
          iVar4 = (t_00->n).x;
          if ((-1 < (long)iVar4) && (iVar4 < DAT_00b6ffa0)) {
            pcVar6 = *(cbtHullTriangle **)(tris + (long)iVar4 * 8);
            if (((pcVar6->super_int3).x == v) ||
               (((pcVar6->super_int3).y == v || ((pcVar6->super_int3).z == v)))) {
              removeb2b(t_00,pcVar6);
            }
            iVar4 = (t_01->n).x;
            if ((-1 < (long)iVar4) && (iVar4 < DAT_00b6ffa0)) {
              pcVar6 = *(cbtHullTriangle **)(tris + (long)iVar4 * 8);
              if ((((pcVar6->super_int3).x == v) || ((pcVar6->super_int3).y == v)) ||
                 ((pcVar6->super_int3).z == v)) {
                removeb2b(t_01,pcVar6);
              }
              cbtHullTriangle::~cbtHullTriangle(t0);
              operator_delete(t0,0x24);
              return;
            }
          }
        }
      }
    }
  }
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
               );
}

Assistant:

void extrude(cbtHullTriangle *t0,int v)
{
	int3 t= *t0;
	int n = tris.count;
	cbtHullTriangle* ta = new cbtHullTriangle(v,t[1],t[2]);
	ta->n = int3(t0->n[0],n+1,n+2);
	tris[t0->n[0]]->neib(t[1],t[2]) = n+0;
	cbtHullTriangle* tb = new cbtHullTriangle(v,t[2],t[0]);
	tb->n = int3(t0->n[1],n+2,n+0);
	tris[t0->n[1]]->neib(t[2],t[0]) = n+1;
	cbtHullTriangle* tc = new cbtHullTriangle(v,t[0],t[1]);
	tc->n = int3(t0->n[2],n+0,n+1);
	tris[t0->n[2]]->neib(t[0],t[1]) = n+2;
	checkit(ta);
	checkit(tb);
	checkit(tc);
	if(hasvert(*tris[ta->n[0]],v)) removeb2b(ta,tris[ta->n[0]]);
	if(hasvert(*tris[tb->n[0]],v)) removeb2b(tb,tris[tb->n[0]]);
	if(hasvert(*tris[tc->n[0]],v)) removeb2b(tc,tris[tc->n[0]]);
	delete t0;

}